

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * pack21_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  *out = (in[1] - base) * 0x200000 | uVar1 - base;
  uVar2 = in[1] - base >> 0xb;
  out[1] = uVar2;
  uVar2 = (in[2] - base) * 0x400 | uVar2;
  out[1] = uVar2;
  out[1] = (in[3] - base) * -0x80000000 | uVar2;
  uVar2 = in[3] - base >> 1;
  out[2] = uVar2;
  out[2] = (in[4] - base) * 0x100000 | uVar2;
  uVar2 = in[4] - base >> 0xc;
  out[3] = uVar2;
  uVar2 = (in[5] - base) * 0x200 | uVar2;
  out[3] = uVar2;
  out[3] = (in[6] - base) * 0x40000000 | uVar2;
  uVar2 = in[6] - base >> 2;
  out[4] = uVar2;
  out[4] = (in[7] - base) * 0x80000 | uVar2;
  out[5] = in[7] - base >> 0xd;
  return out + 6;
}

Assistant:

uint32_t * pack21_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  21 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  10 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  10 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  20 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  9 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  9 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  30 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  19 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  8 );
    ++in;

    return out + 1;
}